

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadNodeGeometry(ColladaParser *this,Node *pNode)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined1 local_138 [8];
  SemanticMappingTable s;
  char *urlMat;
  int attrMaterial;
  string group;
  undefined1 local_b0 [4];
  int attrGroup;
  MeshInstance instance;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *url;
  Node *pNStack_18;
  int attrUrl;
  Node *pNode_local;
  ColladaParser *this_local;
  
  pNStack_18 = pNode;
  pNode_local = (Node *)this;
  url._4_4_ = GetAttribute(this,"url");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)url._4_4_);
  local_28 = (char *)CONCAT44(extraout_var,iVar2);
  if (*local_28 != '#') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Unknown reference format",&local_49);
    ThrowException(this,&local_48);
  }
  Collada::MeshInstance::MeshInstance((MeshInstance *)local_b0);
  std::__cxx11::string::operator=((string *)local_b0,local_28 + 1);
  uVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar3 & 1) == 0) {
    do {
      do {
        while( true ) {
          uVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar3 & 1) == 0) goto LAB_0067dacd;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          bVar1 = IsElement(this,"instance_material");
          if (bVar1) {
            group.field_2._12_4_ = GetAttribute(this,"symbol");
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                              (this->mReader,(ulong)(uint)group.field_2._12_4_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&attrMaterial,(char *)CONCAT44(extraout_var_00,iVar2),
                       (allocator<char> *)((long)&urlMat + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&urlMat + 7));
            urlMat._0_4_ = GetAttribute(this,"target");
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)(uint)urlMat);
            s.mMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 CONCAT44(extraout_var_01,iVar2);
            Collada::SemanticMappingTable::SemanticMappingTable((SemanticMappingTable *)local_138);
            if (*(char *)s.mMap._M_t._M_impl.super__Rb_tree_header._M_node_count == '#') {
              s.mMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   s.mMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
            }
            std::__cxx11::string::operator=
                      ((string *)local_138,
                       (char *)s.mMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
            uVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
            if ((uVar3 & 1) == 0) {
              ReadMaterialVertexInputBinding(this,(SemanticMappingTable *)local_138);
            }
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                                    *)((long)&instance.mMeshOrController.field_2 + 8),
                                   (key_type *)&attrMaterial);
            Collada::SemanticMappingTable::operator=(this_00,(SemanticMappingTable *)local_138);
            Collada::SemanticMappingTable::~SemanticMappingTable((SemanticMappingTable *)local_138);
            std::__cxx11::string::~string((string *)&attrMaterial);
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"instance_geometry");
      if (iVar2 == 0) break;
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),"instance_controller");
    } while (iVar2 != 0);
  }
LAB_0067dacd:
  std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::
  push_back(&pNStack_18->mMeshes,(value_type *)local_b0);
  Collada::MeshInstance::~MeshInstance((MeshInstance *)local_b0);
  return;
}

Assistant:

void ColladaParser::ReadNodeGeometry(Node* pNode)
{
    // referred mesh is given as an attribute of the <instance_geometry> element
    int attrUrl = GetAttribute("url");
    const char* url = mReader->getAttributeValue(attrUrl);
    if (url[0] != '#')
        ThrowException("Unknown reference format");

    Collada::MeshInstance instance;
    instance.mMeshOrController = url + 1; // skipping the leading #

    if (!mReader->isEmptyElement())
    {
        // read material associations. Ignore additional elements in between
        while (mReader->read())
        {
            if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
            {
                if (IsElement("instance_material"))
                {
                    // read ID of the geometry subgroup and the target material
                    int attrGroup = GetAttribute("symbol");
                    std::string group = mReader->getAttributeValue(attrGroup);
                    int attrMaterial = GetAttribute("target");
                    const char* urlMat = mReader->getAttributeValue(attrMaterial);
                    Collada::SemanticMappingTable s;
                    if (urlMat[0] == '#')
                        urlMat++;

                    s.mMatName = urlMat;

                    // resolve further material details + THIS UGLY AND NASTY semantic mapping stuff
                    if (!mReader->isEmptyElement())
                        ReadMaterialVertexInputBinding(s);

                    // store the association
                    instance.mMaterials[group] = s;
                }
            }
            else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
            {
                if (strcmp(mReader->getNodeName(), "instance_geometry") == 0
                    || strcmp(mReader->getNodeName(), "instance_controller") == 0)
                    break;
            }
        }
    }

    // store it
    pNode->mMeshes.push_back(instance);
}